

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_esis.c
# Opt level: O1

void append(int *arr_sz,int *reserved_sz,uint32_t **arr,uint32_t val)

{
  int iVar1;
  uint32_t *puVar2;
  
  iVar1 = *reserved_sz;
  if (*arr_sz == iVar1) {
    *reserved_sz = iVar1 * 2;
    puVar2 = (uint32_t *)realloc(*arr,(long)iVar1 << 3);
    *arr = puVar2;
  }
  puVar2 = *arr;
  iVar1 = *arr_sz;
  *arr_sz = iVar1 + 1;
  puVar2[iVar1] = val;
  return;
}

Assistant:

static void append(int* arr_sz,
		int* reserved_sz,
		uint32_t** arr,
		uint32_t val)
{
	if (*arr_sz == *reserved_sz) {
		*reserved_sz *= 2;
		*arr = realloc(*arr,
			*reserved_sz * sizeof(**arr));
	}
	(*arr)[(*arr_sz)++] = val;
}